

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

ATTRIBUTE_ID * getAttributeId(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  XML_Char XVar1;
  undefined1 *puVar2;
  int iVar3;
  XML_Char *pXVar4;
  KEY name_00;
  PREFIX *pPVar5;
  int local_48;
  int local_44;
  int j;
  int i;
  XML_Char *name;
  ATTRIBUTE_ID *id;
  char *end_local;
  char *start_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
     (iVar3 = poolGrow((STRING_POOL *)((long)parser + 0x330)), iVar3 == 0)) {
    parser_local = (XML_Parser)0x0;
  }
  else {
    puVar2 = *(undefined1 **)((long)parser + 0x348);
    *(undefined1 **)((long)parser + 0x348) = puVar2 + 1;
    *puVar2 = 0;
    pXVar4 = poolStoreString((STRING_POOL *)((long)parser + 0x330),enc,start,end);
    if (pXVar4 == (XML_Char *)0x0) {
      parser_local = (XML_Parser)0x0;
    }
    else {
      name_00 = pXVar4 + 1;
      parser_local = lookup((HASH_TABLE *)((long)parser + 0x2e0),name_00,0x18);
      if ((ATTRIBUTE_ID *)parser_local == (ATTRIBUTE_ID *)0x0) {
        parser_local = (XML_Parser)0x0;
      }
      else if (((ATTRIBUTE_ID *)parser_local)->name == name_00) {
        *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
        if (*(int *)((long)parser + 0x1c8) != 0) {
          if (((((*name_00 == 'x') && (pXVar4[2] == 'm')) && (pXVar4[3] == 'l')) &&
              ((pXVar4[4] == 'n' && (pXVar4[5] == 's')))) &&
             ((pXVar4[6] == '\0' || (pXVar4[6] == ':')))) {
            if (pXVar4[6] == '\0') {
              ((ATTRIBUTE_ID *)parser_local)->prefix = (PREFIX *)((long)parser + 0x390);
            }
            else {
              pPVar5 = (PREFIX *)lookup((HASH_TABLE *)((long)parser + 0x308),pXVar4 + 7,0x10);
              ((ATTRIBUTE_ID *)parser_local)->prefix = pPVar5;
            }
            ((ATTRIBUTE_ID *)parser_local)->xmlns = '\x01';
          }
          else {
            for (local_44 = 0; name_00[local_44] != '\0'; local_44 = local_44 + 1) {
              if (name_00[local_44] == ':') {
                local_48 = 0;
                while( true ) {
                  if (local_44 <= local_48) {
                    if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
                       (iVar3 = poolGrow((STRING_POOL *)((long)parser + 0x330)), iVar3 == 0)) {
                      return (ATTRIBUTE_ID *)0x0;
                    }
                    puVar2 = *(undefined1 **)((long)parser + 0x348);
                    *(undefined1 **)((long)parser + 0x348) = puVar2 + 1;
                    *puVar2 = 0;
                    pPVar5 = (PREFIX *)
                             lookup((HASH_TABLE *)((long)parser + 0x308),
                                    *(KEY *)((long)parser + 0x350),0x10);
                    ((ATTRIBUTE_ID *)parser_local)->prefix = pPVar5;
                    if (((ATTRIBUTE_ID *)parser_local)->prefix->name ==
                        *(XML_Char **)((long)parser + 0x350)) {
                      *(undefined8 *)((long)parser + 0x350) = *(undefined8 *)((long)parser + 0x348);
                      return (ATTRIBUTE_ID *)parser_local;
                    }
                    *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
                    return (ATTRIBUTE_ID *)parser_local;
                  }
                  if ((*(long *)((long)parser + 0x348) == *(long *)((long)parser + 0x340)) &&
                     (iVar3 = poolGrow((STRING_POOL *)((long)parser + 0x330)), iVar3 == 0)) break;
                  XVar1 = name_00[local_48];
                  pXVar4 = *(XML_Char **)((long)parser + 0x348);
                  *(XML_Char **)((long)parser + 0x348) = pXVar4 + 1;
                  *pXVar4 = XVar1;
                  local_48 = local_48 + 1;
                }
                return (ATTRIBUTE_ID *)0x0;
              }
            }
          }
        }
      }
      else {
        *(undefined8 *)((long)parser + 0x348) = *(undefined8 *)((long)parser + 0x350);
      }
    }
  }
  return (ATTRIBUTE_ID *)parser_local;
}

Assistant:

static ATTRIBUTE_ID *
getAttributeId(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  ATTRIBUTE_ID *id;
  const XML_Char *name;
  if (!poolAppendChar(&dtd.pool, XML_T('\0')))
    return 0;
  name = poolStoreString(&dtd.pool, enc, start, end);
  if (!name)
    return 0;
  ++name;
  id = (ATTRIBUTE_ID *)lookup(&dtd.attributeIds, name, sizeof(ATTRIBUTE_ID));
  if (!id)
    return 0;
  if (id->name != name)
    poolDiscard(&dtd.pool);
  else {
    poolFinish(&dtd.pool);
    if (!ns)
      ;
    else if (name[0] == 'x'
        && name[1] == 'm'
        && name[2] == 'l'
        && name[3] == 'n'
        && name[4] == 's'
        && (name[5] == XML_T('\0') || name[5] == XML_T(':'))) {
      if (name[5] == '\0')
        id->prefix = &dtd.defaultPrefix;
      else
        id->prefix = (PREFIX *)lookup(&dtd.prefixes, name + 6, sizeof(PREFIX));
      id->xmlns = 1;
    }
    else {
      int i;
      for (i = 0; name[i]; i++) {
        if (name[i] == XML_T(':')) {
          int j;
          for (j = 0; j < i; j++) {
            if (!poolAppendChar(&dtd.pool, name[j]))
              return 0;
          }
          if (!poolAppendChar(&dtd.pool, XML_T('\0')))
            return 0;
          id->prefix = (PREFIX *)lookup(&dtd.prefixes, poolStart(&dtd.pool), sizeof(PREFIX));
          if (id->prefix->name == poolStart(&dtd.pool))
            poolFinish(&dtd.pool);
          else
            poolDiscard(&dtd.pool);
          break;
        }
      }
    }
  }
  return id;
}